

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yarn4.hpp
# Opt level: O0

void __thiscall trng::yarn4::split(yarn4 *this,uint s,uint n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint in_EDX;
  uint in_ESI;
  undefined4 *in_RDI;
  int i;
  int32_t b [16];
  int32_t a [4];
  int32_t q7;
  int32_t q6;
  int32_t q5;
  int32_t q4;
  int32_t q3;
  int32_t q2;
  int32_t q1;
  int32_t q0;
  invalid_argument *this_00;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int32_t m;
  int32_t (*in_stack_ffffffffffffffa8) [4];
  undefined4 in_stack_ffffffffffffffb0;
  invalid_argument local_20 [20];
  uint local_c;
  
  local_c = in_ESI;
  if ((in_ESI == 0) || (in_ESI <= in_EDX)) {
    this_00 = local_20;
    std::invalid_argument::invalid_argument(this_00,"invalid argument for trng::yarn4::split");
    utility::throw_this<std::invalid_argument>(this_00);
    std::invalid_argument::~invalid_argument(local_20);
  }
  if (1 < local_c) {
    jump((yarn4 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
         (unsigned_long_long)in_RDI);
    uVar1 = in_RDI[4];
    jump((yarn4 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
         (unsigned_long_long)in_RDI);
    uVar2 = in_RDI[4];
    jump((yarn4 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
         (unsigned_long_long)in_RDI);
    uVar3 = in_RDI[4];
    jump((yarn4 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
         (unsigned_long_long)in_RDI);
    uVar4 = in_RDI[4];
    jump((yarn4 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
         (unsigned_long_long)in_RDI);
    uVar5 = in_RDI[4];
    jump((yarn4 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
         (unsigned_long_long)in_RDI);
    uVar6 = in_RDI[4];
    jump((yarn4 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
         (unsigned_long_long)in_RDI);
    uVar7 = in_RDI[4];
    jump((yarn4 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
         (unsigned_long_long)in_RDI);
    m = in_RDI[4];
    uVar9 = uVar2;
    uVar10 = uVar1;
    int_math::gauss<4>((int32_t (*) [16])CONCAT44(m,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,m);
    *in_RDI = uVar5;
    in_RDI[1] = uVar6;
    in_RDI[2] = uVar7;
    in_RDI[3] = m;
    in_RDI[4] = uVar4;
    in_RDI[5] = uVar3;
    in_RDI[6] = uVar2;
    in_RDI[7] = uVar1;
    for (iVar8 = 0; iVar8 < 4; iVar8 = iVar8 + 1) {
      backward((yarn4 *)CONCAT44(uVar10,uVar9));
    }
  }
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void yarn4::split(unsigned int s, unsigned int n) {
#if !(defined TRNG_CUDA)
    if (s < 1 or n >= s)
      utility::throw_this(std::invalid_argument("invalid argument for trng::yarn4::split"));
#endif
    if (s > 1) {
      jump(n + 1ull);
      const int32_t q0{S.r[0]};
      jump(s);
      const int32_t q1{S.r[0]};
      jump(s);
      const int32_t q2{S.r[0]};
      jump(s);
      const int32_t q3{S.r[0]};
      jump(s);
      const int32_t q4{S.r[0]};
      jump(s);
      const int32_t q5{S.r[0]};
      jump(s);
      const int32_t q6{S.r[0]};
      jump(s);
      const int32_t q7{S.r[0]};
      int32_t a[4], b[16];
      a[0] = q4;
      b[0] = q3;
      b[1] = q2;
      b[2] = q1;
      b[3] = q0;
      a[1] = q5;
      b[4] = q4;
      b[5] = q3;
      b[6] = q2;
      b[7] = q1;
      a[2] = q6;
      b[8] = q5;
      b[9] = q4;
      b[10] = q3;
      b[11] = q2;
      a[3] = q7;
      b[12] = q6;
      b[13] = q5;
      b[14] = q4;
      b[15] = q3;
      int_math::gauss<4>(b, a, modulus);
      P.a[0] = a[0];
      P.a[1] = a[1];
      P.a[2] = a[2];
      P.a[3] = a[3];
      S.r[0] = q3;
      S.r[1] = q2;
      S.r[2] = q1;
      S.r[3] = q0;
      for (int i{0}; i < 4; ++i)
        backward();
    }
  }